

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

Result * __thiscall
httplib::ClientImpl::Get
          (Result *__return_storage_ptr__,ClientImpl *this,string *path,Headers *headers,
          Progress *progress)

{
  undefined1 local_270 [8];
  Request req;
  
  local_270 = (undefined1  [8])&req.method._M_string_length;
  req.method._M_dataplus._M_p = (pointer)0x0;
  req.method._M_string_length._0_1_ = 0;
  req.method.field_2._8_8_ = &req.path._M_string_length;
  req.path._M_dataplus._M_p = (pointer)0x0;
  req.path._M_string_length._0_1_ = 0;
  req.headers._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&req.headers;
  req.headers._M_t._M_impl._0_4_ = 0;
  req.headers._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  req.headers._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  req.headers._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  req.headers._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)&req.body._M_string_length;
  req.body._M_dataplus._M_p = (pointer)0x0;
  req.body._M_string_length._0_1_ = 0;
  req.body.field_2._8_8_ = &req.remote_addr._M_string_length;
  req.remote_addr._M_dataplus._M_p = (pointer)0x0;
  req.remote_addr._M_string_length._0_1_ = 0;
  req.remote_addr.field_2._8_4_ = 0xffffffff;
  req._176_8_ = &req.version._M_string_length;
  req.version._M_dataplus._M_p = (pointer)0x0;
  req.version._M_string_length._0_1_ = 0;
  req.version.field_2._8_8_ = &req.target._M_string_length;
  req.target._M_dataplus._M_p = (pointer)0x0;
  req.target._M_string_length._0_1_ = 0;
  req.params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&req.params;
  req.params._M_t._M_impl._0_4_ = 0;
  req.params._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  req.params._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  req.params._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  req.files._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&req.files;
  req.files._M_t._M_impl._0_4_ = 0;
  req.files._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  req.files._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  req.headers._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       req.headers._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  req.params._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       req.params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  req.files._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       req.files._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  req.authorization_count_ = (size_t)progress;
  memset(&req.files._M_t._M_impl.super__Rb_tree_header._M_header._M_right,0,0xa8);
  req.ssl = (SSL *)0x14;
  req.is_chunked_content_provider_ = false;
  req._553_7_ = 0;
  req.redirect_count_ = 0;
  req.content_length_ = 0;
  req.content_provider_.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  req.content_provider_.super__Function_base._M_functor._M_pod_data[8] = '\0';
  req.content_provider_.super__Function_base._M_functor._9_7_ = 0;
  req.content_provider_.super__Function_base._M_manager._0_1_ = 0;
  req.content_provider_._17_8_ = 0;
  std::__cxx11::string::assign(local_270);
  std::__cxx11::string::_M_assign((string *)(req.method.field_2._M_local_buf + 8));
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator=((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)((long)&req.path.field_2 + 8),&headers->_M_t);
  std::function<bool_(unsigned_long,_unsigned_long)>::operator=
            ((function<bool_(unsigned_long,_unsigned_long)> *)&req.content_receiver._M_invoker,
             (function<bool_(unsigned_long,_unsigned_long)> *)req.authorization_count_);
  send_(__return_storage_ptr__,this,(Request *)local_270);
  Request::~Request((Request *)local_270);
  return __return_storage_ptr__;
}

Assistant:

inline Result ClientImpl::Get(const std::string& path, const Headers& headers,
        Progress progress) {
        Request req;
        req.method = "GET";
        req.path = path;
        req.headers = headers;
        req.progress = std::move(progress);

        return send_(std::move(req));
    }